

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

void __thiscall csv::CSVRow::iterator::iterator(iterator *this,CSVRow *_reader,int _i)

{
  undefined4 uVar1;
  size_t sVar2;
  shared_ptr<csv::CSVField> local_88 [2];
  CSVField local_68;
  undefined1 local_30 [28];
  int _i_local;
  CSVRow *_reader_local;
  iterator *this_local;
  
  this->daddy = _reader;
  local_30._20_4_ = _i;
  unique0x1000012d = _reader;
  _reader_local = (CSVRow *)this;
  std::shared_ptr<csv::CSVField>::shared_ptr(&this->field,(nullptr_t)0x0);
  uVar1 = local_30._20_4_;
  this->i = local_30._20_4_;
  sVar2 = size(this->daddy);
  if ((int)uVar1 < (int)sVar2) {
    CSVRow::operator[](&local_68,this->daddy,(long)(int)local_30._20_4_);
    std::make_shared<csv::CSVField,csv::CSVField>((CSVField *)local_30);
    std::shared_ptr<csv::CSVField>::operator=(&this->field,(shared_ptr<csv::CSVField> *)local_30);
    std::shared_ptr<csv::CSVField>::~shared_ptr((shared_ptr<csv::CSVField> *)local_30);
  }
  else {
    std::shared_ptr<csv::CSVField>::shared_ptr(local_88,(nullptr_t)0x0);
    std::shared_ptr<csv::CSVField>::operator=(&this->field,local_88);
    std::shared_ptr<csv::CSVField>::~shared_ptr(local_88);
  }
  return;
}

Assistant:

CSVRow::iterator::iterator(const CSVRow* _reader, int _i)
        : daddy(_reader), i(_i) {
        if (_i < (int)this->daddy->size())
            this->field = std::make_shared<CSVField>(
                this->daddy->operator[](_i));
        else
            this->field = nullptr;
    }